

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O3

float deqp::gls::destructiveMedian<float>(vector<float,_std::allocator<float>_> *data)

{
  long lVar1;
  float fVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  
  pfVar7 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar5 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pfVar6 = (float *)(((long)pfVar5 - (long)pfVar7 >> 1 & 0xfffffffffffffffcU) + (long)pfVar7);
  uVar4 = (long)pfVar5 - (long)pfVar7;
  if ((uVar4 != 0) && (pfVar6 != pfVar5)) {
    uVar4 = (long)pfVar5 - (long)pfVar7 >> 2;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar7,pfVar6,pfVar5,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    pfVar7 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar7;
  }
  fVar8 = *pfVar6;
  if ((uVar4 & 4) == 0) {
    pfVar5 = pfVar7 + 1;
    if (pfVar5 != pfVar6 && pfVar7 != pfVar6) {
      fVar9 = *pfVar7;
      do {
        fVar2 = *pfVar5;
        pfVar3 = pfVar5;
        if (*pfVar5 <= fVar9) {
          fVar2 = fVar9;
          pfVar3 = pfVar7;
        }
        pfVar7 = pfVar3;
        fVar9 = fVar2;
        pfVar5 = pfVar5 + 1;
      } while (pfVar5 != pfVar6);
    }
    fVar8 = (fVar8 + *pfVar7) * 0.5;
  }
  return fVar8;
}

Assistant:

float destructiveMedian (vector<T>& data)
{
	const typename vector<T>::iterator mid = data.begin()+data.size()/2;

	std::nth_element(data.begin(), mid, data.end());

	if (data.size()%2 == 0) // Even number of elements, need average of two centermost elements
		return (*mid + *std::max_element(data.begin(), mid))*0.5f; // Data is partially sorted around mid, mid is half an item after center
	else
		return *mid;
}